

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O0

CURLcode cf_haproxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  Curl_cfilter *cf_00;
  Curl_easy *data_00;
  size_t sVar1;
  char *buf;
  bool local_69;
  long local_50;
  ssize_t nwritten;
  size_t len;
  int *piStack_38;
  CURLcode result;
  cf_haproxy_ctx *ctx;
  _Bool *done_local;
  Curl_easy *pCStack_20;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  piStack_38 = (int *)cf->ctx;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ctx = (cf_haproxy_ctx *)done;
  done_local._7_1_ = blocking;
  pCStack_20 = data;
  data_local = (Curl_easy *)cf;
  len._4_4_ = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (len._4_4_ != CURLE_OK) {
    return len._4_4_;
  }
  if ((ctx->state & 1) == 0) {
    return CURLE_OK;
  }
  if (*piStack_38 == 0) {
    len._4_4_ = cf_haproxy_date_out_set((Curl_cfilter *)data_local,pCStack_20);
    if (len._4_4_ != CURLE_OK) goto LAB_001170eb;
    *piStack_38 = 1;
LAB_00117025:
    sVar1 = Curl_dyn_len((dynbuf *)(piStack_38 + 2));
    data_00 = pCStack_20;
    if (sVar1 != 0) {
      cf_00 = (Curl_cfilter *)data_local->id;
      buf = Curl_dyn_ptr((dynbuf *)(piStack_38 + 2));
      local_50 = Curl_conn_cf_send(cf_00,data_00,buf,sVar1,false,(CURLcode *)((long)&len + 4));
      if (local_50 < 0) {
        if (len._4_4_ != CURLE_AGAIN) goto LAB_001170eb;
        len._4_4_ = CURLE_OK;
        local_50 = 0;
      }
      Curl_dyn_tail((dynbuf *)(piStack_38 + 2),sVar1 - local_50);
      sVar1 = Curl_dyn_len((dynbuf *)(piStack_38 + 2));
      if (sVar1 != 0) {
        len._4_4_ = CURLE_OK;
        goto LAB_001170eb;
      }
    }
    *piStack_38 = 2;
  }
  else {
    len._4_4_ = CURLE_OK;
    if (*piStack_38 == 1) goto LAB_00117025;
  }
  Curl_dyn_free((dynbuf *)(piStack_38 + 2));
LAB_001170eb:
  local_69 = false;
  if (len._4_4_ == CURLE_OK) {
    local_69 = *piStack_38 == 2;
  }
  *(bool *)&ctx->state = local_69;
  *(byte *)((long)&(data_local->multi_queue)._list + 4) =
       *(byte *)((long)&(data_local->multi_queue)._list + 4) & 0xfe | (byte)ctx->state & 1;
  return len._4_4_;
}

Assistant:

static CURLcode cf_haproxy_connect(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   bool blocking, bool *done)
{
  struct cf_haproxy_ctx *ctx = cf->ctx;
  CURLcode result;
  size_t len;

  DEBUGASSERT(ctx);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  switch(ctx->state) {
  case HAPROXY_INIT:
    result = cf_haproxy_date_out_set(cf, data);
    if(result)
      goto out;
    ctx->state = HAPROXY_SEND;
    FALLTHROUGH();
  case HAPROXY_SEND:
    len = Curl_dyn_len(&ctx->data_out);
    if(len > 0) {
      ssize_t nwritten;
      nwritten = Curl_conn_cf_send(cf->next, data,
                                   Curl_dyn_ptr(&ctx->data_out), len, FALSE,
                                   &result);
      if(nwritten < 0) {
        if(result != CURLE_AGAIN)
          goto out;
        result = CURLE_OK;
        nwritten = 0;
      }
      Curl_dyn_tail(&ctx->data_out, len - (size_t)nwritten);
      if(Curl_dyn_len(&ctx->data_out) > 0) {
        result = CURLE_OK;
        goto out;
      }
    }
    ctx->state = HAPROXY_DONE;
    FALLTHROUGH();
  default:
    Curl_dyn_free(&ctx->data_out);
    break;
  }

out:
  *done = (!result) && (ctx->state == HAPROXY_DONE);
  cf->connected = *done;
  return result;
}